

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameStatisticsObserver.cpp
# Opt level: O2

void __thiscall GameStatisticsObserver::update(GameStatisticsObserver *this)

{
  Player *this_00;
  pointer ppPVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  pointer ppPVar6;
  string local_50;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  poVar4 = std::operator<<((ostream *)&std::cout,"| ");
  std::operator<<(poVar4,"Player");
  lVar2 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
  std::operator<<((ostream *)&std::cout,"Owned Zone");
  lVar2 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
  std::operator<<((ostream *)&std::cout,"Energy Cubes");
  lVar2 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
  std::operator<<((ostream *)&std::cout,"Victory Points");
  lVar2 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
  poVar4 = std::operator<<((ostream *)&std::cout,"Life Points");
  poVar4 = std::operator<<(poVar4," |");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  ppPVar1 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar6 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
    this_00 = *ppPVar6;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    poVar4 = std::operator<<((ostream *)&std::cout,"| ");
    poVar4 = std::operator<<(poVar4,0x20);
    psVar5 = Player::getPlayerName_abi_cxx11_(this_00);
    std::operator<<(poVar4,(string *)psVar5);
    lVar2 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
    Player::getZoneName_abi_cxx11_(&local_50,this_00);
    std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
    iVar3 = Player::getEnergyCubes(this_00);
    std::ostream::operator<<((ostream *)&std::cout,iVar3);
    lVar2 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
    iVar3 = Player::getVictoryPoints(this_00);
    std::ostream::operator<<((ostream *)&std::cout,iVar3);
    lVar2 = std::cout;
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 0x19;
    iVar3 = Player::getLifePoints(this_00);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    poVar4 = std::operator<<(poVar4," |");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------------------------------------"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void GameStatisticsObserver::update() {

    int width = 25;
    cout << "--------------------------------------------------------------------------------------------------------------" << endl;
    cout << right << "| "<< "Player" ;
    cout << right << setw(width) << "Owned Zone";
    cout << right << setw(width) << "Energy Cubes" ;
    cout << right << setw(width) << "Victory Points" ;
    cout << right << setw(width) << "Life Points" << " |" << endl;
    cout << "--------------------------------------------------------------------------------------------------------------" << endl;

    for(Player* player : Game::players){

        cout << right << "| " << setfill(' ') << player->getPlayerName();
        cout << right << setw(width) << player->getZoneName();
        cout << right << setw(width) << player->getEnergyCubes();
        cout << right << setw(width) << player->getVictoryPoints();
        cout << right  << setw(width) << player->getLifePoints() << " |" << endl;
        cout << "--------------------------------------------------------------------------------------------------------------" << endl;

    }
    cout << endl;
}